

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

uv_signal_t * uv__signal_first_handle(int signum)

{
  int in_EDI;
  uv_signal_t *handle;
  uv_signal_t lookup;
  uv_signal_s *in_stack_ffffffffffffff80;
  uv_signal_s *local_8;
  
  local_8 = uv__signal_tree_s_RB_NFIND((uv__signal_tree_s *)0x0,in_stack_ffffffffffffff80);
  if ((local_8 == (uv_signal_s *)0x0) || (local_8->signum != in_EDI)) {
    local_8 = (uv_signal_s *)0x0;
  }
  return local_8;
}

Assistant:

static uv_signal_t* uv__signal_first_handle(int signum) {
  /* This function must be called with the signal lock held. */
  uv_signal_t lookup;
  uv_signal_t* handle;

  lookup.signum = signum;
  lookup.loop = NULL;

  handle = RB_NFIND(uv__signal_tree_s, &uv__signal_tree, &lookup);

  if (handle != NULL && handle->signum == signum)
    return handle;

  return NULL;
}